

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

bool Geometry::InPoly(Point *p,vector<Geometry::Point,_std::allocator<Geometry::Point>_> *poly)

{
  double x_00;
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  bool local_129;
  bool local_121;
  int z;
  int y;
  double dStack_e0;
  Point local_d8;
  Point local_c8;
  int local_ac;
  int local_a8;
  int x;
  Point local_98;
  Point local_88;
  Line local_78;
  Point local_58;
  undefined1 auStack_48 [8];
  Point b;
  Point a;
  int i;
  int cnt;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> *poly_local;
  Point *p_local;
  
  a.y._4_4_ = 0;
  for (a.y._0_4_ = 0;
      sVar5 = std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::size(poly),
      (ulong)(long)a.y._0_4_ < sVar5; a.y._0_4_ = a.y._0_4_ + 1) {
    pvVar6 = std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::operator[]
                       (poly,(long)a.y._0_4_);
    b.y = pvVar6->x;
    dVar1 = pvVar6->y;
    sVar5 = std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::size(poly);
    pvVar6 = std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::operator[]
                       (poly,(ulong)(long)(a.y._0_4_ + 1) % sVar5);
    local_98.x = pvVar6->x;
    local_98.y = pvVar6->y;
    local_58.x = p->x;
    local_58.y = p->y;
    local_88.x = b.y;
    local_88.y = dVar1;
    auStack_48 = (undefined1  [8])local_98.x;
    b.x = local_98.y;
    Line::Line(&local_78,&local_88,&local_98);
    bVar2 = OnLine(&local_58,&local_78);
    Line::~Line(&local_78);
    Point::~Point(&local_98);
    Point::~Point(&local_88);
    Point::~Point(&local_58);
    if (bVar2) {
      p_local._7_1_ = 1;
      local_a8 = 1;
    }
    else {
      local_c8.x = b.y;
      local_d8.x = p->x;
      local_d8.y = p->y;
      _z = (double)auStack_48;
      dStack_e0 = b.x;
      local_c8.y = dVar1;
      x_00 = det(&local_c8,&local_d8,(Point *)&z);
      iVar3 = sgn(x_00);
      Point::~Point((Point *)&z);
      Point::~Point(&local_d8);
      Point::~Point(&local_c8);
      local_ac = iVar3;
      iVar3 = sgn(dVar1 - p->y);
      iVar4 = sgn(b.x - p->y);
      local_121 = false;
      if ((0 < local_ac) && (local_121 = false, iVar3 < 1)) {
        local_121 = 0 < iVar4;
      }
      local_129 = false;
      if ((local_ac < 0) && (local_129 = false, iVar4 < 1)) {
        local_129 = 0 < iVar3;
      }
      a.y._4_4_ = ((uint)local_121 + a.y._4_4_) - (uint)local_129;
      local_a8 = 0;
    }
    Point::~Point((Point *)auStack_48);
    Point::~Point((Point *)&b.y);
    if (local_a8 != 0) goto LAB_0010ff66;
  }
  p_local._7_1_ = a.y._4_4_ != 0;
LAB_0010ff66:
  return (bool)(p_local._7_1_ & 1);
}

Assistant:

bool InPoly(Point p, std::vector<Point> poly){
		int cnt = 0;
		for(int i = 0; i < poly.size(); i++){
			Point a = poly[i];
			Point b = poly[(i + 1) % poly.size()];
			if(OnLine(p, Line(a, b)))
				return true;
			int x = sgn(det(a, p, b));
			int y = sgn(a.y - p.y);
			int z = sgn(b.y - p.y);
			cnt += (x > 0 && y <= 0 && z > 0);
			cnt -= (x < 0 && z <= 0 && y > 0);
		}
		return cnt;
	}